

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O3

void __thiscall avro::MemoryOutputStream::~MemoryOutputStream(MemoryOutputStream *this)

{
  pointer ppuVar1;
  pointer ppuVar2;
  
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__MemoryOutputStream_00192368;
  ppuVar2 = (this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppuVar1 = (this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppuVar2 != ppuVar1) {
    do {
      if (*ppuVar2 != (uchar *)0x0) {
        operator_delete__(*ppuVar2);
        ppuVar1 = (this->data_).
                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppuVar2 = ppuVar2 + 1;
    } while (ppuVar2 != ppuVar1);
    ppuVar2 = (this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppuVar2 != (pointer)0x0) {
    operator_delete(ppuVar2,(long)(this->data_).
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar2
                   );
    return;
  }
  return;
}

Assistant:

~MemoryOutputStream() {
        for (std::vector<uint8_t*>::const_iterator it = data_.begin();
            it != data_.end(); ++it) {
            delete[] *it;
        }
    }